

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

void __thiscall
cmGeneratorTarget::ComputeImportInfo
          (cmGeneratorTarget *this,string *desired_config,ImportInfo *info)

{
  bool bVar1;
  TargetType TVar2;
  char *pcVar3;
  allocator local_329;
  string local_328;
  char *local_308;
  char *reps;
  char *config_reps;
  undefined1 local_2f0 [8];
  string linkProp_3;
  string local_2c8;
  char *local_2a8;
  char *libs_1;
  char *config_libs_1;
  undefined1 local_290 [8];
  string linkProp_2;
  string local_268;
  char *local_248;
  char *libs;
  char *config_libs;
  undefined1 local_230 [8];
  string linkProp_1;
  string local_208;
  char *local_1e8;
  char *implib;
  char *config_implib;
  undefined1 local_1d0 [8];
  string impProp_1;
  string local_1a8;
  char *local_188;
  char *no_soname;
  char *config_no_soname;
  undefined1 local_170 [8];
  string soProp_1;
  string local_148;
  char *local_128;
  char *soname;
  char *config_soname;
  undefined1 local_110 [8];
  string soProp;
  string local_e8;
  char *local_c8;
  char *location;
  char *config_location;
  undefined1 local_b0 [8];
  string impProp;
  char *propertyLibs;
  undefined1 local_80 [8];
  string linkProp;
  undefined1 local_50 [8];
  string suffix;
  char *imp;
  char *loc;
  ImportInfo *info_local;
  string *desired_config_local;
  cmGeneratorTarget *this_local;
  
  info->NoSOName = false;
  imp = (char *)0x0;
  suffix.field_2._8_8_ = 0;
  loc = &info->NoSOName;
  info_local = (ImportInfo *)desired_config;
  desired_config_local = (string *)this;
  std::__cxx11::string::string((string *)local_50);
  bVar1 = cmTarget::GetMappedConfig
                    (this->Target,(string *)info_local,&imp,(char **)((long)&suffix.field_2 + 8),
                     (string *)local_50);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_80,"INTERFACE_LINK_LIBRARIES",(allocator *)((long)&propertyLibs + 7))
    ;
    std::allocator<char>::~allocator((allocator<char> *)((long)&propertyLibs + 7));
    impProp.field_2._8_8_ = GetProperty(this,(string *)local_80);
    TVar2 = GetType(this);
    if (TVar2 != INTERFACE_LIBRARY) {
      if (impProp.field_2._8_8_ == 0) {
        std::__cxx11::string::operator=((string *)local_80,"IMPORTED_LINK_INTERFACE_LIBRARIES");
        std::__cxx11::string::operator+=((string *)local_80,(string *)local_50);
        impProp.field_2._8_8_ = GetProperty(this,(string *)local_80);
      }
      if (impProp.field_2._8_8_ == 0) {
        std::__cxx11::string::operator=((string *)local_80,"IMPORTED_LINK_INTERFACE_LIBRARIES");
        impProp.field_2._8_8_ = GetProperty(this,(string *)local_80);
      }
    }
    if (impProp.field_2._8_8_ != 0) {
      std::__cxx11::string::operator=((string *)(loc + 0xa8),(string *)local_80);
      std::__cxx11::string::operator=((string *)(loc + 0x88),(char *)impProp.field_2._8_8_);
    }
    std::__cxx11::string::~string((string *)local_80);
    TVar2 = GetType(this);
    if (TVar2 == INTERFACE_LIBRARY) {
      linkProp.field_2._8_4_ = 1;
    }
    else {
      if (imp == (char *)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)local_b0,"IMPORTED_LOCATION",(allocator *)((long)&config_location + 7))
        ;
        std::allocator<char>::~allocator((allocator<char> *)((long)&config_location + 7));
        std::__cxx11::string::operator+=((string *)local_b0,(string *)local_50);
        location = GetProperty(this,(string *)local_b0);
        if (location == (char *)0x0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_e8,"IMPORTED_LOCATION",
                     (allocator *)(soProp.field_2._M_local_buf + 0xf));
          pcVar3 = GetProperty(this,&local_e8);
          std::__cxx11::string::~string((string *)&local_e8);
          std::allocator<char>::~allocator((allocator<char> *)(soProp.field_2._M_local_buf + 0xf));
          local_c8 = pcVar3;
          if (pcVar3 != (char *)0x0) {
            std::__cxx11::string::operator=((string *)(loc + 8),pcVar3);
          }
        }
        else {
          std::__cxx11::string::operator=((string *)(loc + 8),location);
        }
        std::__cxx11::string::~string((string *)local_b0);
      }
      else {
        std::__cxx11::string::operator=((string *)(loc + 8),imp);
      }
      TVar2 = GetType(this);
      if (TVar2 == SHARED_LIBRARY) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)local_110,"IMPORTED_SONAME",(allocator *)((long)&config_soname + 7));
        std::allocator<char>::~allocator((allocator<char> *)((long)&config_soname + 7));
        std::__cxx11::string::operator+=((string *)local_110,(string *)local_50);
        soname = GetProperty(this,(string *)local_110);
        if (soname == (char *)0x0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_148,"IMPORTED_SONAME",
                     (allocator *)(soProp_1.field_2._M_local_buf + 0xf));
          pcVar3 = GetProperty(this,&local_148);
          std::__cxx11::string::~string((string *)&local_148);
          std::allocator<char>::~allocator((allocator<char> *)(soProp_1.field_2._M_local_buf + 0xf))
          ;
          local_128 = pcVar3;
          if (pcVar3 != (char *)0x0) {
            std::__cxx11::string::operator=((string *)(loc + 0x28),pcVar3);
          }
        }
        else {
          std::__cxx11::string::operator=((string *)(loc + 0x28),soname);
        }
        std::__cxx11::string::~string((string *)local_110);
      }
      TVar2 = GetType(this);
      if (TVar2 == SHARED_LIBRARY) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)local_170,"IMPORTED_NO_SONAME",
                   (allocator *)((long)&config_no_soname + 7));
        std::allocator<char>::~allocator((allocator<char> *)((long)&config_no_soname + 7));
        std::__cxx11::string::operator+=((string *)local_170,(string *)local_50);
        no_soname = GetProperty(this,(string *)local_170);
        if (no_soname == (char *)0x0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_1a8,"IMPORTED_NO_SONAME",
                     (allocator *)(impProp_1.field_2._M_local_buf + 0xf));
          pcVar3 = GetProperty(this,&local_1a8);
          std::__cxx11::string::~string((string *)&local_1a8);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(impProp_1.field_2._M_local_buf + 0xf));
          local_188 = pcVar3;
          if (pcVar3 != (char *)0x0) {
            bVar1 = cmSystemTools::IsOn(pcVar3);
            *loc = bVar1;
          }
        }
        else {
          bVar1 = cmSystemTools::IsOn(no_soname);
          *loc = bVar1;
        }
        std::__cxx11::string::~string((string *)local_170);
      }
      if (suffix.field_2._8_8_ == 0) {
        TVar2 = GetType(this);
        if ((TVar2 == SHARED_LIBRARY) || (bVar1 = IsExecutableWithExports(this), bVar1)) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)local_1d0,"IMPORTED_IMPLIB",(allocator *)((long)&config_implib + 7));
          std::allocator<char>::~allocator((allocator<char> *)((long)&config_implib + 7));
          std::__cxx11::string::operator+=((string *)local_1d0,(string *)local_50);
          implib = GetProperty(this,(string *)local_1d0);
          if (implib == (char *)0x0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&local_208,"IMPORTED_IMPLIB",
                       (allocator *)(linkProp_1.field_2._M_local_buf + 0xf));
            pcVar3 = GetProperty(this,&local_208);
            std::__cxx11::string::~string((string *)&local_208);
            std::allocator<char>::~allocator
                      ((allocator<char> *)(linkProp_1.field_2._M_local_buf + 0xf));
            local_1e8 = pcVar3;
            if (pcVar3 != (char *)0x0) {
              std::__cxx11::string::operator=((string *)(loc + 0x48),pcVar3);
            }
          }
          else {
            std::__cxx11::string::operator=((string *)(loc + 0x48),implib);
          }
          std::__cxx11::string::~string((string *)local_1d0);
        }
      }
      else {
        std::__cxx11::string::operator=((string *)(loc + 0x48),(char *)suffix.field_2._8_8_);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)local_230,"IMPORTED_LINK_DEPENDENT_LIBRARIES",
                 (allocator *)((long)&config_libs + 7));
      std::allocator<char>::~allocator((allocator<char> *)((long)&config_libs + 7));
      std::__cxx11::string::operator+=((string *)local_230,(string *)local_50);
      libs = GetProperty(this,(string *)local_230);
      if (libs == (char *)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_268,"IMPORTED_LINK_DEPENDENT_LIBRARIES",
                   (allocator *)(linkProp_2.field_2._M_local_buf + 0xf));
        pcVar3 = GetProperty(this,&local_268);
        std::__cxx11::string::~string((string *)&local_268);
        std::allocator<char>::~allocator((allocator<char> *)(linkProp_2.field_2._M_local_buf + 0xf))
        ;
        local_248 = pcVar3;
        if (pcVar3 != (char *)0x0) {
          std::__cxx11::string::operator=((string *)(loc + 200),pcVar3);
        }
      }
      else {
        std::__cxx11::string::operator=((string *)(loc + 200),libs);
      }
      std::__cxx11::string::~string((string *)local_230);
      bVar1 = LinkLanguagePropagatesToDependents(this);
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)local_290,"IMPORTED_LINK_INTERFACE_LANGUAGES",
                   (allocator *)((long)&config_libs_1 + 7));
        std::allocator<char>::~allocator((allocator<char> *)((long)&config_libs_1 + 7));
        std::__cxx11::string::operator+=((string *)local_290,(string *)local_50);
        libs_1 = GetProperty(this,(string *)local_290);
        if (libs_1 == (char *)0x0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_2c8,"IMPORTED_LINK_INTERFACE_LANGUAGES",
                     (allocator *)(linkProp_3.field_2._M_local_buf + 0xf));
          pcVar3 = GetProperty(this,&local_2c8);
          std::__cxx11::string::~string((string *)&local_2c8);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(linkProp_3.field_2._M_local_buf + 0xf));
          local_2a8 = pcVar3;
          if (pcVar3 != (char *)0x0) {
            std::__cxx11::string::operator=((string *)(loc + 0x68),pcVar3);
          }
        }
        else {
          std::__cxx11::string::operator=((string *)(loc + 0x68),libs_1);
        }
        std::__cxx11::string::~string((string *)local_290);
      }
      TVar2 = GetType(this);
      if (TVar2 == STATIC_LIBRARY) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)local_2f0,"IMPORTED_LINK_INTERFACE_MULTIPLICITY",
                   (allocator *)((long)&config_reps + 7));
        std::allocator<char>::~allocator((allocator<char> *)((long)&config_reps + 7));
        std::__cxx11::string::operator+=((string *)local_2f0,(string *)local_50);
        reps = GetProperty(this,(string *)local_2f0);
        if (reps == (char *)0x0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_328,"IMPORTED_LINK_INTERFACE_MULTIPLICITY",&local_329);
          pcVar3 = GetProperty(this,&local_328);
          std::__cxx11::string::~string((string *)&local_328);
          std::allocator<char>::~allocator((allocator<char> *)&local_329);
          local_308 = pcVar3;
          if (pcVar3 != (char *)0x0) {
            __isoc99_sscanf(pcVar3,"%u",loc + 4);
          }
        }
        else {
          __isoc99_sscanf(reps,"%u",loc + 4);
        }
        std::__cxx11::string::~string((string *)local_2f0);
      }
      linkProp.field_2._8_4_ = 0;
    }
  }
  else {
    linkProp.field_2._8_4_ = 1;
  }
  std::__cxx11::string::~string((string *)local_50);
  return;
}

Assistant:

void cmGeneratorTarget::ComputeImportInfo(std::string const& desired_config,
                                 ImportInfo& info) const
{
  // This method finds information about an imported target from its
  // properties.  The "IMPORTED_" namespace is reserved for properties
  // defined by the project exporting the target.

  // Initialize members.
  info.NoSOName = false;

  const char* loc = 0;
  const char* imp = 0;
  std::string suffix;
  if (!this->Target->GetMappedConfig(desired_config, &loc, &imp, suffix))
    {
    return;
    }

  // Get the link interface.
  {
  std::string linkProp = "INTERFACE_LINK_LIBRARIES";
  const char *propertyLibs = this->GetProperty(linkProp);

  if (this->GetType() != cmState::INTERFACE_LIBRARY)
    {
    if(!propertyLibs)
      {
      linkProp = "IMPORTED_LINK_INTERFACE_LIBRARIES";
      linkProp += suffix;
      propertyLibs = this->GetProperty(linkProp);
      }

    if(!propertyLibs)
      {
      linkProp = "IMPORTED_LINK_INTERFACE_LIBRARIES";
      propertyLibs = this->GetProperty(linkProp);
      }
    }
  if(propertyLibs)
    {
    info.LibrariesProp = linkProp;
    info.Libraries = propertyLibs;
    }
  }
  if(this->GetType() == cmState::INTERFACE_LIBRARY)
    {
    return;
    }

  // A provided configuration has been chosen.  Load the
  // configuration's properties.

  // Get the location.
  if(loc)
    {
    info.Location = loc;
    }
  else
    {
    std::string impProp = "IMPORTED_LOCATION";
    impProp += suffix;
    if(const char* config_location = this->GetProperty(impProp))
      {
      info.Location = config_location;
      }
    else if(const char* location = this->GetProperty("IMPORTED_LOCATION"))
      {
      info.Location = location;
      }
    }

  // Get the soname.
  if(this->GetType() == cmState::SHARED_LIBRARY)
    {
    std::string soProp = "IMPORTED_SONAME";
    soProp += suffix;
    if(const char* config_soname = this->GetProperty(soProp))
      {
      info.SOName = config_soname;
      }
    else if(const char* soname = this->GetProperty("IMPORTED_SONAME"))
      {
      info.SOName = soname;
      }
    }

  // Get the "no-soname" mark.
  if(this->GetType() == cmState::SHARED_LIBRARY)
    {
    std::string soProp = "IMPORTED_NO_SONAME";
    soProp += suffix;
    if(const char* config_no_soname = this->GetProperty(soProp))
      {
      info.NoSOName = cmSystemTools::IsOn(config_no_soname);
      }
    else if(const char* no_soname = this->GetProperty("IMPORTED_NO_SONAME"))
      {
      info.NoSOName = cmSystemTools::IsOn(no_soname);
      }
    }

  // Get the import library.
  if(imp)
    {
    info.ImportLibrary = imp;
    }
  else if(this->GetType() == cmState::SHARED_LIBRARY ||
          this->IsExecutableWithExports())
    {
    std::string impProp = "IMPORTED_IMPLIB";
    impProp += suffix;
    if(const char* config_implib = this->GetProperty(impProp))
      {
      info.ImportLibrary = config_implib;
      }
    else if(const char* implib = this->GetProperty("IMPORTED_IMPLIB"))
      {
      info.ImportLibrary = implib;
      }
    }

  // Get the link dependencies.
  {
  std::string linkProp = "IMPORTED_LINK_DEPENDENT_LIBRARIES";
  linkProp += suffix;
  if(const char* config_libs = this->GetProperty(linkProp))
    {
    info.SharedDeps = config_libs;
    }
  else if(const char* libs =
          this->GetProperty("IMPORTED_LINK_DEPENDENT_LIBRARIES"))
    {
    info.SharedDeps = libs;
    }
  }

  // Get the link languages.
  if(this->LinkLanguagePropagatesToDependents())
    {
    std::string linkProp = "IMPORTED_LINK_INTERFACE_LANGUAGES";
    linkProp += suffix;
    if(const char* config_libs = this->GetProperty(linkProp))
      {
      info.Languages = config_libs;
      }
    else if(const char* libs =
            this->GetProperty("IMPORTED_LINK_INTERFACE_LANGUAGES"))
      {
      info.Languages = libs;
      }
    }

  // Get the cyclic repetition count.
  if(this->GetType() == cmState::STATIC_LIBRARY)
    {
    std::string linkProp = "IMPORTED_LINK_INTERFACE_MULTIPLICITY";
    linkProp += suffix;
    if(const char* config_reps = this->GetProperty(linkProp))
      {
      sscanf(config_reps, "%u", &info.Multiplicity);
      }
    else if(const char* reps =
            this->GetProperty("IMPORTED_LINK_INTERFACE_MULTIPLICITY"))
      {
      sscanf(reps, "%u", &info.Multiplicity);
      }
    }
}